

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.cc
# Opt level: O2

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          *qpoints)

{
  uint32_t *out_val;
  bool bVar1;
  uint32_t *out_val_00;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  oit;
  DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder;
  
  bVar1 = DecoderBuffer::Decode<unsigned_int>(buffer,(uint *)this);
  if (!bVar1) {
    return false;
  }
  if (0x1f < (this->qinfo_).quantization_bits) {
    return false;
  }
  bVar1 = DecoderBuffer::Decode<float>(buffer,&(this->qinfo_).range);
  if (bVar1) {
    out_val = &this->num_points_;
    bVar1 = DecoderBuffer::Decode<unsigned_int>(buffer,out_val);
    if ((bVar1) &&
       ((this->num_points_from_header_ == 0 || (this->num_points_ == this->num_points_from_header_))
       )) {
      out_val_00 = &this->compression_level_;
      bVar1 = DecoderBuffer::Decode<unsigned_int>(buffer,out_val_00);
      if (bVar1) {
        if (6 < *out_val_00) {
          printf("FloatPointsTreeDecoder: compression level %i not supported.\n");
          return false;
        }
        if ((ulong)*out_val != 0) {
          oit.oit_.container =
               (back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                )(back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                  )qpoints;
          std::
          vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          ::reserve(qpoints,(ulong)*out_val);
          switch(*out_val_00) {
          case 0:
            DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                      (&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<0>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      (&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                      (&qpoints_decoder);
            break;
          case 1:
            DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<1>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&qpoints_decoder);
            break;
          case 2:
            DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<2>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&qpoints_decoder);
            break;
          case 3:
            DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<3>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&qpoints_decoder);
            break;
          case 4:
            DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<4> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<4>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<4> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<4> *)&qpoints_decoder);
            break;
          case 5:
            DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<5>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&qpoints_decoder);
            break;
          case 6:
            DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&qpoints_decoder,3);
            DynamicIntegerPointsKdTreeDecoder<6>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&qpoints_decoder,buffer,&oit);
            DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&qpoints_decoder);
            break;
          default:
            goto LAB_0014cb51;
          }
        }
        return ((long)(qpoints->
                      super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(qpoints->
                     super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0xc == (ulong)*out_val;
      }
    }
  }
LAB_0014cb51:
  return false;
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal(
    DecoderBuffer *buffer, std::vector<Point3ui> *qpoints) {
  if (!buffer->Decode(&qinfo_.quantization_bits)) {
    return false;
  }
  if (qinfo_.quantization_bits > 31) {
    return false;
  }
  if (!buffer->Decode(&qinfo_.range)) {
    return false;
  }
  if (!buffer->Decode(&num_points_)) {
    return false;
  }
  if (num_points_from_header_ > 0 && num_points_ != num_points_from_header_) {
    return false;
  }
  if (!buffer->Decode(&compression_level_)) {
    return false;
  }

  // Only allow compression level in [0..6].
  if (6 < compression_level_) {
    DRACO_LOGE("FloatPointsTreeDecoder: compression level %i not supported.\n",
               compression_level_);
    return false;
  }

  std::back_insert_iterator<std::vector<Point3ui>> oit_qpoints =
      std::back_inserter(*qpoints);
  ConversionOutputIterator<std::back_insert_iterator<std::vector<Point3ui>>,
                           Converter>
      oit(oit_qpoints);
  if (num_points_ > 0) {
    qpoints->reserve(num_points_);
    switch (compression_level_) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      default:
        return false;
    }
  }

  if (qpoints->size() != num_points_) {
    return false;
  }
  return true;
}